

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

void __thiscall rw::Geometry::buildMeshes(Geometry *this)

{
  int numMeshes_00;
  uint uVar1;
  void *__s;
  Mesh *pMVar2;
  ulong uVar3;
  int local_40;
  uint32 idx;
  int32 i_3;
  int32 i_2;
  int32 i_1;
  int32 i;
  int32 *numIndices;
  int32 numMeshes;
  Mesh *mesh;
  Triangle *tri;
  Geometry *this_local;
  
  if ((this->flags & 0x1000000) == 0) {
    (*DAT_001685f8)(this->meshHeader);
    this->meshHeader = (MeshHeader *)0x0;
    numMeshes_00 = (this->matList).numMaterials;
    if ((this->flags & 1) == 0) {
      __s = mustmalloc_LOC((long)numMeshes_00 << 2,0x1000f,
                           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 529"
                          );
      memset(__s,0,(long)numMeshes_00 << 2);
      mesh = (Mesh *)this->triangles;
      for (i_2 = 0; i_2 < this->numTriangles; i_2 = i_2 + 1) {
        uVar3 = (ulong)*(ushort *)((long)&mesh->indices + 6);
        *(int *)((long)__s + uVar3 * 4) = *(int *)((long)__s + uVar3 * 4) + 3;
        mesh = (Mesh *)&mesh->numIndices;
      }
      allocateMeshes(this,numMeshes_00,this->numTriangles * 3,0);
      pMVar2 = MeshHeader::getMeshes(this->meshHeader);
      for (i_3 = 0; i_3 < numMeshes_00; i_3 = i_3 + 1) {
        pMVar2[i_3].material = (this->matList).materials[i_3];
        pMVar2[i_3].numIndices = *(uint32 *)((long)__s + (long)i_3 * 4);
      }
      MeshHeader::setupIndices(this->meshHeader);
      (*DAT_001685f8)(__s);
      for (idx = 0; (int)idx < numMeshes_00; idx = idx + 1) {
        pMVar2[(int)idx].numIndices = 0;
      }
      mesh = (Mesh *)this->triangles;
      for (local_40 = 0; local_40 < this->numTriangles; local_40 = local_40 + 1) {
        uVar1 = pMVar2[*(ushort *)((long)&mesh->indices + 6)].numIndices;
        pMVar2[*(ushort *)((long)&mesh->indices + 6)].indices[uVar1] = *(uint16 *)&mesh->indices;
        pMVar2[*(ushort *)((long)&mesh->indices + 6)].indices[uVar1 + 1] =
             *(uint16 *)((long)&mesh->indices + 2);
        pMVar2[*(ushort *)((long)&mesh->indices + 6)].indices[uVar1 + 2] =
             *(uint16 *)((long)&mesh->indices + 4);
        pMVar2[*(ushort *)((long)&mesh->indices + 6)].numIndices = uVar1 + 3;
        mesh = (Mesh *)&mesh->numIndices;
      }
    }
    else {
      buildTristrips(this);
    }
  }
  else {
    fprintf(_stderr,"WARNING: trying Geometry::buildMeshes() on pre-instanced geometry\n");
  }
  return;
}

Assistant:

void
Geometry::buildMeshes(void)
{
	Triangle *tri;
	Mesh *mesh;

	if(this->flags & Geometry::NATIVE){
		fprintf(stderr, "WARNING: trying Geometry::buildMeshes() on pre-instanced geometry\n");
		return;
	}

	rwFree(this->meshHeader);
	this->meshHeader = nil;
	int32 numMeshes = this->matList.numMaterials;
	if((this->flags & Geometry::TRISTRIP) == 0){
		int32 *numIndices = rwNewT(int32, numMeshes,
			MEMDUR_FUNCTION | ID_GEOMETRY);
		memset(numIndices, 0, numMeshes*sizeof(int32));

		// count indices per mesh
		tri = this->triangles;
		for(int32 i = 0; i < this->numTriangles; i++){
			assert(tri->matId < numMeshes);
			numIndices[tri->matId] += 3;
			tri++;
		}
		// setup meshes
		this->allocateMeshes(numMeshes, this->numTriangles*3, 0);
		mesh = this->meshHeader->getMeshes();
		for(int32 i = 0; i < numMeshes; i++){
			mesh[i].material = this->matList.materials[i];
			mesh[i].numIndices = numIndices[i];
		}
		this->meshHeader->setupIndices();
		rwFree(numIndices);

		// now fill in the indices
		for(int32 i = 0; i < numMeshes; i++)
			mesh[i].numIndices = 0;
		tri = this->triangles;
		for(int32 i = 0; i < this->numTriangles; i++){
			uint32 idx = mesh[tri->matId].numIndices;
			mesh[tri->matId].indices[idx++] = tri->v[0];
			mesh[tri->matId].indices[idx++] = tri->v[1];
			mesh[tri->matId].indices[idx++] = tri->v[2];
			mesh[tri->matId].numIndices = idx;
			tri++;
		}
	}else
		this->buildTristrips();
}